

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void read_coeffs_tx_intra_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,int col,
               TX_SIZE tx_size)

{
  BLOCK_SIZE plane_bsize;
  TX_CLASS TVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  MB_MODE_INFO *pMVar6;
  FRAME_CONTEXT *pFVar7;
  tran_low_t *ptVar8;
  eob_info *peVar9;
  int16_t *piVar10;
  undefined1 auVar11 [13];
  uint3 uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  uint5 uVar16;
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  byte bVar19;
  byte bVar20;
  byte bVar21;
  char cVar22;
  TX_TYPE TVar23;
  ushort uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint *puVar33;
  qm_val_t *pqVar34;
  byte bVar35;
  byte bVar36;
  uint *puVar37;
  aom_cdf_prob (*paaVar38) [5];
  int iVar39;
  uint uVar40;
  ulong uVar41;
  byte *pbVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  aom_cdf_prob (*cdf) [12];
  byte bVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  byte *pbVar52;
  int iVar53;
  ulong uVar54;
  byte bVar55;
  bool bVar56;
  bool bVar57;
  undefined4 uVar60;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  char cStack_669;
  long lStack_650;
  int iStack_648;
  byte abStack_558 [12];
  byte abStack_54c [4];
  byte abStack_548 [1304];
  
  if ((*(dcb->xd).mi)->skip_txfm != '\0') {
    return;
  }
  pMVar6 = *(dcb->xd).mi;
  puVar37 = (uint *)((dcb->xd).plane[plane].above_entropy_context + col);
  plane_bsize = av1_ss_size_lookup[pMVar6->bsize][(dcb->xd).plane[plane].subsampling_x]
                [(dcb->xd).plane[plane].subsampling_y];
  uVar45 = (ulong)plane_bsize;
  puVar33 = (uint *)((dcb->xd).plane[plane].left_entropy_context + row);
  uVar54 = (ulong)tx_size;
  switch(tx_size) {
  case '\0':
    bVar20 = (byte)*puVar37;
    bVar19 = (byte)*puVar33;
    cStack_669 = get_txb_ctx_general_dc_sign_contexts
                 [(long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)(bVar19 >> 3)) +
                  (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)(bVar20 >> 3)) + 0x20];
    if (plane == 0) {
      if (uVar45 != 0) {
LAB_0017246b:
        uVar43 = (uint)(bVar20 & 7);
        if (3 < (bVar20 & 7)) {
          uVar43 = 4;
        }
        uVar26 = (uint)(bVar19 & 7);
        if (3 < (bVar19 & 7)) {
          uVar26 = 4;
        }
        uVar45 = (ulong)uVar43;
        uVar41 = (ulong)uVar26;
LAB_0017248a:
        uVar45 = (ulong)(byte)get_txb_ctx_general_skip_contexts[uVar41 + uVar45 * 5];
        goto LAB_00172615;
      }
LAB_001724a6:
      uVar45 = 0;
      goto LAB_00172615;
    }
    lVar47 = ((ulong)(uVar45 != 0) * 3 + 1) - (ulong)(bVar20 == 0);
    bVar56 = bVar19 == 0;
    break;
  case '\x01':
    uVar41 = 0;
    lVar47 = 0;
    bVar56 = true;
    do {
      bVar57 = bVar56;
      uVar41 = (ulong)(uint)((int)uVar41 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar37 + lVar47) >> 3)));
      lVar47 = 1;
      bVar56 = false;
    } while (bVar57);
    lVar47 = 0;
    bVar56 = true;
    do {
      bVar57 = bVar56;
      uVar41 = (long)(int)uVar41 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar33 + lVar47) >> 3));
      lVar47 = 1;
      bVar56 = false;
    } while (bVar57);
    cStack_669 = get_txb_ctx_general_dc_sign_contexts[uVar41 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_8X8) {
        bVar20 = (*(byte *)((long)puVar37 + 1) | (byte)*puVar37) & 7;
        uVar43 = (uint)bVar20;
        if (3 < bVar20) {
          uVar43 = 4;
        }
        bVar20 = (*(byte *)((long)puVar33 + 1) | (byte)*puVar33) & 7;
        uVar26 = (uint)bVar20;
        if (3 < bVar20) {
          uVar26 = 4;
        }
        uVar45 = (ulong)uVar43;
        uVar41 = (ulong)uVar26;
        goto LAB_0017253c;
      }
      goto LAB_001724a6;
    }
    lVar47 = ((ulong)((0x3cfff0UL >> (uVar45 & 0x3f) & 1) != 0) * 3 + 1) -
             (ulong)((short)*puVar37 == 0);
    bVar56 = (short)*puVar33 == 0;
    break;
  case '\x02':
    lVar47 = 0;
    uVar41 = 0;
    do {
      uVar41 = (ulong)(uint)((int)uVar41 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar37 + lVar47) >> 3)));
      lVar47 = lVar47 + 1;
    } while (lVar47 != 4);
    lVar47 = 0;
    do {
      uVar41 = (long)(int)uVar41 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar33 + lVar47) >> 3));
      lVar47 = lVar47 + 1;
    } while (lVar47 != 4);
    cStack_669 = get_txb_ctx_general_dc_sign_contexts[uVar41 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_16X16) {
        uVar43 = *puVar37 >> 0x10 | *puVar37;
        bVar20 = (byte)(uVar43 >> 8) | (byte)uVar43;
        uVar43 = *puVar33 >> 0x10 | *puVar33;
        bVar19 = (byte)(uVar43 >> 8) | (byte)uVar43;
        goto LAB_0017246b;
      }
      goto LAB_001724a6;
    }
    lVar47 = ((ulong)((0x30ff80UL >> (uVar45 & 0x3f) & 1) != 0) * 3 + 1) - (ulong)(*puVar37 == 0);
    bVar56 = *puVar33 == 0;
    break;
  case '\x03':
    lVar47 = 0;
    uVar41 = 0;
    do {
      uVar41 = (ulong)(uint)((int)uVar41 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar37 + lVar47) >> 3)));
      lVar47 = lVar47 + 1;
    } while (lVar47 != 8);
    lVar47 = 0;
    do {
      uVar41 = (long)(int)uVar41 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar33 + lVar47) >> 3));
      lVar47 = lVar47 + 1;
    } while (lVar47 != 8);
    cStack_669 = get_txb_ctx_general_dc_sign_contexts[uVar41 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_32X32) {
        uVar43 = *puVar37 | puVar37[1];
        auVar11[0xc] = (char)(uVar43 >> 0x18);
        auVar11._0_12_ = ZEXT712(0);
        uVar16 = CONCAT32(auVar11._10_3_,(ushort)(byte)(uVar43 >> 0x10));
        auVar18._5_8_ = 0;
        auVar18._0_5_ = uVar16;
        auVar58[5] = 0;
        auVar58[4] = (byte)(uVar43 >> 8);
        auVar58._6_7_ = SUB137(auVar18 << 0x40,6);
        auVar58._0_4_ = uVar43 & 0xff;
        auVar58._13_3_ = 0;
        uVar60 = (undefined4)uVar16;
        uVar12 = auVar11._10_3_ >> 0x10;
        auVar62._4_3_ = uVar12;
        auVar62._0_4_ = uVar60;
        auVar62[7] = 0;
        auVar62._8_4_ = uVar60;
        auVar62._12_3_ = uVar12;
        auVar62[0xf] = 0;
        uVar43 = *puVar33 | puVar33[1];
        uVar45 = (ulong)(ushort)uVar43 & 0xffffffffffff00ff;
        auVar13._8_4_ = 0;
        auVar13._0_8_ = uVar45;
        auVar13[0xc] = (char)(uVar43 >> 0x18);
        auVar14[8] = (char)(uVar43 >> 0x10);
        auVar14._0_8_ = uVar45;
        auVar14[9] = 0;
        auVar14._10_3_ = auVar13._10_3_;
        auVar17._5_8_ = 0;
        auVar17._0_5_ = auVar14._8_5_;
        auVar59._0_4_ = (undefined4)uVar45;
        auVar15[4] = (char)(uVar43 >> 8);
        auVar15._0_4_ = auVar59._0_4_;
        auVar15[5] = 0;
        auVar15._6_7_ = SUB137(auVar17 << 0x40,6);
        auVar59._4_9_ = auVar15._4_9_;
        auVar59._13_3_ = 0;
        uVar12 = auVar13._10_3_ >> 0x10;
        auVar61._4_3_ = uVar12;
        auVar61._0_4_ = auVar14._8_4_;
        auVar61[7] = 0;
        auVar61._8_4_ = auVar14._8_4_;
        auVar61._12_3_ = uVar12;
        auVar61[0xf] = 0;
        uVar43 = (SUB164(auVar62 | auVar58,4) | SUB164(auVar62 | auVar58,0)) & 7;
        uVar45 = (ulong)uVar43;
        if (3 < uVar43) {
          uVar45 = 4;
        }
        uVar43 = (SUB164(auVar61 | auVar59,4) | SUB164(auVar61 | auVar59,0)) & 7;
        uVar41 = (ulong)uVar43;
        if (3 < uVar43) {
          uVar41 = 4;
        }
        goto LAB_0017248a;
      }
      goto LAB_001724a6;
    }
    lVar47 = ((ulong)(uVar45 - 10 < 6) * 3 + 1) - (ulong)(*(long *)puVar37 == 0);
    bVar56 = *(long *)puVar33 == 0;
    break;
  default:
    lVar48 = (long)*(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    lVar47 = (long)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    lVar50 = 0;
    uVar41 = 0;
    do {
      uVar41 = (ulong)(uint)((int)uVar41 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar37 + lVar50) >> 3)));
      lVar50 = lVar50 + 1;
    } while (lVar50 < lVar48);
    lVar50 = 0;
    do {
      uVar41 = (long)(int)uVar41 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar33 + lVar50) >> 3));
      lVar50 = lVar50 + 1;
    } while (lVar50 < lVar47);
    cStack_669 = get_txb_ctx_general_dc_sign_contexts[uVar41 + 0x20];
    if (plane == 0) {
      uVar45 = 0;
      if (txsize_to_bsize[uVar54] == plane_bsize) goto LAB_00172615;
      lVar50 = 0;
      do {
        uVar43 = (uint)uVar45 | (uint)*(byte *)((long)puVar37 + lVar50);
        uVar45 = (ulong)uVar43;
        lVar50 = lVar50 + 1;
      } while (lVar50 < lVar48);
      lVar48 = 0;
      uVar26 = 0;
      do {
        uVar26 = uVar26 | *(byte *)((long)puVar33 + lVar48);
        lVar48 = lVar48 + 1;
      } while (lVar48 < lVar47);
      uVar43 = uVar43 & 7;
      uVar45 = (ulong)uVar43;
      if (3 < uVar43) {
        uVar45 = 4;
      }
      uVar41 = (ulong)(uVar26 & 7);
      if (3 < (uVar26 & 7)) {
        uVar41 = 4;
      }
LAB_0017253c:
      uVar45 = (ulong)(byte)get_txb_ctx_general_skip_contexts[uVar41 + uVar45 * 5];
      goto LAB_00172615;
    }
    switch(uVar54) {
    case 0:
      bVar56 = (byte)*puVar37 == 0;
      goto LAB_001725bb;
    case 1:
      bVar56 = (short)*puVar37 == 0;
      goto LAB_001725db;
    case 2:
      bVar56 = *puVar37 == 0;
      break;
    case 3:
      bVar56 = *(long *)puVar37 == 0;
      goto LAB_00172589;
    case 4:
      bVar56 = *(long *)(puVar37 + 2) == 0 && *(long *)puVar37 == 0;
      goto LAB_001725a1;
    case 5:
      bVar56 = (byte)*puVar37 == 0;
      goto LAB_001725db;
    case 6:
      bVar56 = (short)*puVar37 == 0;
      goto LAB_001725bb;
    case 7:
      bVar56 = (short)*puVar37 == 0;
      break;
    case 8:
      bVar56 = *puVar37 == 0;
      goto LAB_001725db;
    case 9:
      bVar56 = *puVar37 == 0;
      goto LAB_00172589;
    case 10:
      bVar56 = *(long *)puVar37 == 0;
      break;
    case 0xb:
      bVar56 = *(long *)puVar37 == 0;
      goto LAB_001725a1;
    case 0xc:
      bVar56 = *(long *)(puVar37 + 2) == 0 && *(long *)puVar37 == 0;
      goto LAB_00172589;
    case 0xd:
      bVar56 = (byte)*puVar37 == 0;
      break;
    case 0xe:
      bVar56 = *puVar37 == 0;
LAB_001725bb:
      bVar56 = !bVar56;
      bVar57 = (byte)*puVar33 == 0;
      goto LAB_001725e2;
    case 0xf:
      bVar56 = (short)*puVar37 == 0;
LAB_00172589:
      bVar56 = !bVar56;
      bVar57 = *(long *)puVar33 == 0;
      goto LAB_001725e2;
    case 0x10:
      bVar56 = *(long *)puVar37 == 0;
LAB_001725db:
      bVar56 = !bVar56;
      bVar57 = (short)*puVar33 == 0;
      goto LAB_001725e2;
    case 0x11:
      bVar56 = *puVar37 == 0;
LAB_001725a1:
      bVar56 = !bVar56;
      bVar57 = *(long *)(puVar33 + 2) == 0 && *(long *)puVar33 == 0;
      goto LAB_001725e2;
    case 0x12:
      bVar56 = *(long *)(puVar37 + 2) == 0 && *(long *)puVar37 == 0;
      break;
    default:
      bVar56 = false;
      bVar57 = false;
      goto LAB_001725e5;
    }
    bVar56 = !bVar56;
    bVar57 = *puVar33 == 0;
LAB_001725e2:
    bVar57 = !bVar57;
LAB_001725e5:
    uVar45 = (ulong)("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                     [txsize_to_bsize[uVar54]] <
                    "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar45]) * 3 +
             (ulong)bVar57 + (ulong)bVar56 + 7;
    goto LAB_00172615;
  }
  uVar45 = (lVar47 - (ulong)bVar56) + 8;
LAB_00172615:
  iVar25 = 1 << ((char)(dcb->xd).bd + 7U & 0x1f);
  pFVar7 = (dcb->xd).tile_ctx;
  uVar26 = (uint)""[uVar54] + (uint)""[uVar54] + 1 >> 1;
  uVar27 = uVar26 & 0xff;
  uVar2 = *(ushort *)&pMVar6->field_0xa7;
  uVar3 = dcb->cb_offset[plane];
  ptVar8 = dcb->dqcoeff_block[plane];
  iVar28 = av1_get_tx_scale(tx_size);
  uVar43 = 3;
  if ((1 < tx_size - 0xb) && (tx_size != 4)) {
    uVar43 = (uint)tx_size;
    if (uVar43 == 0x11) {
      uVar43 = 9;
    }
    else if (uVar43 == 0x12) {
      uVar43 = 10;
    }
  }
  uVar41 = (ulong)(uVar43 << 2);
  uVar60 = *(undefined4 *)((long)tx_size_high_log2 + uVar41);
  iVar53 = *(int *)((long)tx_size_wide + uVar41);
  iVar44 = *(int *)((long)tx_size_high + uVar41);
  iVar29 = aom_read_symbol_(r,pFVar7->txb_skip_cdf[uVar27][uVar45],2);
  peVar9 = dcb->eob_data[plane];
  uVar4 = dcb->txb_offset[plane];
  peVar9[uVar4].eob = 0;
  peVar9[uVar4].max_scan_line = 0;
  if (iVar29 == 0) {
    if (plane == 0) {
      av1_read_tx_type(cm,&dcb->xd,row,col,tx_size,r);
    }
    bVar57 = plane != 0;
    bVar20 = av1_get_tx_type(&dcb->xd,plane != 0,row,col,tx_size,
                             (uint)(cm->features).reduced_tx_set_used);
    uVar45 = (ulong)bVar20;
    TVar1 = ""[uVar45];
    pqVar34 = av1_get_iqmatrix(&cm->quant_params,&dcb->xd,plane,tx_size,bVar20);
    piVar10 = av1_scan_orders[tx_size][bVar20].scan;
    bVar56 = 9 < bVar20;
    switch(""[uVar54]) {
    case '\0':
      cdf = (aom_cdf_prob (*) [12])(pFVar7->eob_flag_cdf16[bVar57] + bVar56);
      iVar29 = 5;
      break;
    case '\x01':
      cdf = (aom_cdf_prob (*) [12])(pFVar7->eob_flag_cdf32[bVar57] + bVar56);
      iVar29 = 6;
      break;
    case '\x02':
      cdf = (aom_cdf_prob (*) [12])(pFVar7->eob_flag_cdf64[bVar57] + bVar56);
      iVar29 = 7;
      break;
    case '\x03':
      cdf = (aom_cdf_prob (*) [12])(pFVar7->eob_flag_cdf128[bVar57] + bVar56);
      iVar29 = 8;
      break;
    case '\x04':
      cdf = (aom_cdf_prob (*) [12])(pFVar7->eob_flag_cdf256[bVar57] + bVar56);
      iVar29 = 9;
      break;
    case '\x05':
      cdf = (aom_cdf_prob (*) [12])(pFVar7->eob_flag_cdf512[bVar57] + bVar56);
      iVar29 = 10;
      break;
    default:
      cdf = pFVar7->eob_flag_cdf1024[bVar57] + bVar56;
      iVar29 = 0xb;
    }
    iVar30 = aom_read_symbol_(r,*cdf,iVar29);
    sVar5 = av1_eob_offset_bits[(long)iVar30 + 1];
    iVar29 = 0;
    if (0 < sVar5) {
      iVar31 = aom_read_symbol_(r,pFVar7->eob_extra_cdf[uVar27][bVar57][iVar30 + -2],2);
      iVar29 = 1 << ((char)sVar5 - 1U & 0x1f);
      if (iVar31 == 0) {
        iVar29 = 0;
      }
      for (iVar31 = sVar5 + -2; iVar31 != -1; iVar31 = iVar31 + -1) {
        iVar32 = aom_read_bit_(r);
        iVar39 = 1 << ((byte)iVar31 & 0x1f);
        if (iVar32 == 0) {
          iVar39 = 0;
        }
        iVar29 = iVar29 + iVar39;
      }
    }
    iVar31 = 0;
    if (2 < av1_eob_group_start[(long)iVar30 + 1]) {
      iVar31 = iVar29;
    }
    uVar43 = iVar31 + (uint)(ushort)av1_eob_group_start[(long)iVar30 + 1];
    peVar9[uVar4].eob = (uint16_t)uVar43;
    if ((uVar43 & 0xfffe) != 0) {
      memset(abStack_558,0,((long)iVar53 + 4) * ((long)iVar44 + 4) + 0x10);
    }
    uVar43 = uVar43 & 0xffff;
    sVar5 = piVar10[(ulong)uVar43 - 1];
    iVar44 = (int)sVar5;
    bVar19 = (byte)uVar60;
    if (uVar43 == 1) {
      uVar41 = 0;
    }
    else {
      iVar53 = iVar53 << (bVar19 & 0x1f);
      if (iVar53 / 8 < (int)(uVar43 - 1)) {
        uVar41 = (ulong)(iVar53 / 4 < (int)(uVar43 - 1)) | 2;
      }
      else {
        uVar41 = 1;
      }
    }
    iVar29 = aom_read_symbol_(r,(aom_cdf_prob *)
                                ((long)pFVar7->coeff_base_eob_cdf[0][bVar57][uVar41] +
                                (ulong)(uVar27 << 6)),3);
    iVar53 = iVar29 + 1;
    bVar21 = (byte)iVar53;
    iVar30 = iVar44 >> (bVar19 & 0x1f);
    bVar55 = (byte)uVar26;
    if (1 < iVar29) {
      iVar29 = iVar30 << (bVar19 & 0x1f);
      if (sVar5 == 0) {
        lVar47 = 0;
      }
      else {
        lVar47 = 7;
        if ((((9 < bVar20) || (1 < iVar44 - iVar29)) || (1 < iVar30)) &&
           (((0xa800UL >> (uVar45 & 0x3f) & 1) == 0 || (iVar30 != 0)))) {
          if (iVar44 != iVar29) {
            lVar47 = 0xe;
          }
          if ((0x5400UL >> (uVar45 & 0x3f) & 1) == 0) {
            lVar47 = 0xe;
          }
        }
      }
      bVar36 = 3;
      if (bVar55 < 3) {
        bVar36 = bVar55;
      }
      uVar43 = 0xfffffffd;
      do {
        bVar21 = (byte)iVar53;
        uVar43 = uVar43 + 3;
        if (0xb < uVar43) break;
        iVar29 = aom_read_symbol_(r,pFVar7->coeff_br_cdf[bVar36][bVar57][lVar47],4);
        iVar53 = iVar53 + iVar29;
        bVar21 = (byte)iVar53;
      } while (2 < iVar29);
    }
    abStack_558[iVar44 + iVar30 * 4] = bVar21;
    if (1 < peVar9[uVar4].eob) {
      if (2 < bVar55) {
        bVar55 = 3;
      }
      uVar45 = (ulong)(peVar9[uVar4].eob - 2);
      iVar53 = 1 << (bVar19 & 0x1f);
      lVar47 = (long)iVar53;
      if (bVar20 < 10) {
        lStack_650 = (long)(2 << (bVar19 & 0x1f));
        iVar44 = iVar53 + 4;
        for (; 0 < (int)uVar45; uVar45 = uVar45 - 1) {
          sVar5 = piVar10[uVar45];
          uVar43 = (int)sVar5 >> (bVar19 & 0x1f);
          lVar48 = (long)(int)((int)sVar5 + uVar43 * 4);
          pbVar52 = abStack_558 + lVar48;
          bVar20 = pbVar52[lVar47 + 4];
          if (2 < pbVar52[lVar47 + 4]) {
            bVar20 = 3;
          }
          bVar21 = abStack_558[lVar48 + 1];
          if (2 < bVar21) {
            bVar21 = 3;
          }
          bVar36 = pbVar52[lVar47 + 5];
          if (2 < bVar36) {
            bVar36 = 3;
          }
          bVar46 = pbVar52[lStack_650 + 8];
          if (2 < bVar46) {
            bVar46 = 3;
          }
          bVar35 = abStack_558[lVar48 + 2];
          if (2 < bVar35) {
            bVar35 = 3;
          }
          bVar20 = (byte)(bVar46 + bVar36 + bVar21 + bVar20 + bVar35 + 1) >> 1;
          if (3 < bVar20) {
            bVar20 = 4;
          }
          iVar29 = aom_read_symbol_(r,pFVar7->coeff_base_cdf[uVar27][bVar57]
                                      [(long)av1_nz_map_ctx_offset[uVar54][sVar5] + (ulong)bVar20],4
                                   );
          if (2 < iVar29) {
            uVar26 = (int)sVar5 - (uVar43 << (bVar19 & 0x1f));
            iVar30 = uVar43 * iVar44 + uVar26;
            bVar20 = abStack_558[(long)iVar30 + 1];
            if (0xe < abStack_558[(long)iVar30 + 1]) {
              bVar20 = 0xf;
            }
            bVar21 = abStack_558[iVar30 + iVar44];
            if (0xe < bVar21) {
              bVar21 = 0xf;
            }
            bVar36 = abStack_558[iVar30 + 1 + iVar44];
            if (0xe < bVar36) {
              bVar36 = 0xf;
            }
            bVar20 = (byte)(bVar21 + bVar20 + bVar36 + 1) >> 1;
            if (5 < bVar20) {
              bVar20 = 6;
            }
            paaVar38 = pFVar7->coeff_br_cdf[bVar55][bVar57] + 0xe;
            if ((int)(uVar26 | uVar43) < 2) {
              paaVar38 = pFVar7->coeff_br_cdf[bVar55][bVar57] + 7;
            }
            uVar43 = 0xfffffffd;
            do {
              uVar43 = uVar43 + 3;
              if (0xb < uVar43) break;
              iVar30 = aom_read_symbol_(r,paaVar38[bVar20],4);
              iVar29 = iVar29 + iVar30;
            } while (2 < iVar30);
          }
          *pbVar52 = (byte)iVar29;
        }
        uVar45 = 0;
      }
      else {
        lStack_650 = (long)(2 << (bVar19 & 0x1f));
      }
      iVar53 = iVar53 + 4;
      for (; -1 < (int)uVar45; uVar45 = (ulong)((int)uVar45 - 1)) {
        sVar5 = piVar10[uVar45];
        uVar43 = (uint)sVar5;
        iVar29 = (int)uVar43 >> (bVar19 & 0x1f);
        lVar48 = (long)(int)(uVar43 + iVar29 * 4);
        pbVar52 = abStack_558 + lVar48;
        iVar44 = (uint)""[abStack_558[lVar48 + 1]] + (uint)""[pbVar52[iVar53]];
        if (TVar1 == '\x02') {
          iVar44 = iVar44 + (uint)""[abStack_558[lVar48 + 3]] + (uint)""[abStack_558[lVar48 + 2]];
          pbVar42 = abStack_558 + lVar48 + 4;
        }
        else if (TVar1 == '\0') {
          iVar44 = iVar44 + (uint)""[abStack_558[lStack_650 + lVar48 + 8]] +
                            (uint)""[abStack_558[lVar47 + lVar48 + 5]];
          pbVar42 = abStack_558 + lVar48 + 2;
        }
        else {
          iVar44 = iVar44 + (uint)""[abStack_54c[(3 << (bVar19 & 0x1f)) + lVar48]] +
                            (uint)""[abStack_558[lStack_650 + lVar48 + 8]];
          pbVar42 = pbVar52 + (long)(4 << (bVar19 & 0x1f)) + 0x10;
        }
        iVar30 = 0;
        if (uVar43 != 0 || TVar1 != '\0') {
          uVar26 = iVar44 + (uint)""[*pbVar42] + 1 >> 1;
          if (3 < uVar26) {
            uVar26 = 4;
          }
          if (TVar1 == '\x02') {
            uVar41 = (ulong)(uVar43 & ~(-1 << (bVar19 & 0x1f)));
LAB_00173016:
            iVar30 = nz_map_ctx_offset_1d[uVar41];
          }
          else {
            if (TVar1 == '\x01') {
              uVar41 = (ulong)iVar29;
              goto LAB_00173016;
            }
            if (TVar1 != '\0') goto LAB_00173022;
            iVar30 = (int)av1_nz_map_ctx_offset[uVar54][(int)uVar43];
          }
          iVar30 = uVar26 + iVar30;
        }
LAB_00173022:
        iVar44 = aom_read_symbol_(r,pFVar7->coeff_base_cdf[uVar27][bVar57][iVar30],4);
        if (2 < iVar44) {
          uVar40 = iVar29 << (bVar19 & 0x1f);
          iVar30 = uVar43 - uVar40;
          iVar31 = iVar29 * iVar53 + iVar30;
          uVar26 = (uint)abStack_558[iVar53 + iVar31] + (uint)abStack_558[(long)iVar31 + 1];
          if (TVar1 == '\x02') {
            uVar26 = uVar26 + abStack_558[(long)iVar31 + 2] + 1 >> 1;
            if (5 < uVar26) {
              uVar26 = 6;
            }
            if (sVar5 != 0) {
              if (uVar43 != uVar40) goto LAB_00173128;
              uVar26 = uVar26 + 7;
            }
          }
          else if (TVar1 == '\x01') {
            uVar26 = uVar26 + abStack_558[iVar31 + iVar53 * 2] + 1 >> 1;
            if (5 < uVar26) {
              uVar26 = 6;
            }
            if (sVar5 != 0) {
              if (iVar29 != 0) goto LAB_00173128;
LAB_001730f3:
              uVar26 = uVar26 + 7;
            }
          }
          else {
            if (TVar1 == '\0') {
              uVar26 = uVar26 + abStack_558[(long)(iVar53 + iVar31) + 1] + 1 >> 1;
              if (5 < uVar26) {
                uVar26 = 6;
              }
              if (sVar5 == 0) goto LAB_0017312b;
              if ((iVar29 < 2) && (iVar30 < 2)) goto LAB_001730f3;
            }
LAB_00173128:
            uVar26 = uVar26 + 0xe;
          }
LAB_0017312b:
          uVar43 = 0xfffffffd;
          do {
            uVar43 = uVar43 + 3;
            if (0xb < uVar43) break;
            iVar29 = aom_read_symbol_(r,pFVar7->coeff_br_cdf[bVar55][bVar57][uVar26],4);
            iVar44 = iVar44 + iVar29;
          } while (2 < iVar29);
        }
        *pbVar52 = (byte)iVar44;
      }
    }
    uVar27 = iVar25 - 1;
    uVar26 = -iVar25;
    iStack_648 = 0;
    uVar43 = 0;
    for (uVar45 = 0; uVar45 < peVar9[uVar4].eob; uVar45 = uVar45 + 1) {
      iVar25 = (int)piVar10[uVar45];
      bVar20 = abStack_558[iVar25 + (iVar25 >> (bVar19 & 0x1f)) * 4];
      uVar40 = (uint)bVar20;
      if (bVar20 != 0) {
        uVar24 = peVar9[uVar4].max_scan_line;
        if ((int)(uint)peVar9[uVar4].max_scan_line <= iVar25) {
          uVar24 = piVar10[uVar45];
        }
        peVar9[uVar4].max_scan_line = uVar24;
        if (uVar45 == 0) {
          iVar53 = aom_read_symbol_(r,pFVar7->dc_sign_cdf[bVar57][cStack_669],2);
          cVar22 = (char)iVar53;
        }
        else {
          iVar53 = aom_read_bit_(r);
          cVar22 = (char)iVar53;
        }
        if (0xe < bVar20) {
          iVar44 = 0;
          iVar53 = -1;
          do {
            if (iVar44 != 0) goto LAB_0017329a;
            iVar44 = aom_read_bit_(r);
            iVar53 = iVar53 + 1;
          } while (iVar53 != 0x14);
          aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,
                             "Invalid length in read_golomb");
          iVar53 = 0x14;
LAB_0017329a:
          if (iVar53 < 1) {
            iVar53 = 0;
          }
          iVar44 = 1;
          while (bVar56 = iVar53 != 0, iVar53 = iVar53 + -1, bVar56) {
            iVar29 = aom_read_bit_(r);
            iVar44 = iVar29 + iVar44 * 2;
          }
          uVar40 = ((uint)bVar20 + iVar44) - 1;
        }
        uVar51 = -uVar40;
        if (cVar22 == '\0') {
          uVar51 = uVar40;
        }
        if (uVar45 == 0) {
          uVar43 = uVar51;
        }
        iVar53 = (int)(dcb->xd).plane[plane].seg_dequant_QTX[uVar2 & 7][(long)piVar10[uVar45] != 0];
        if (pqVar34 != (qm_val_t *)0x0) {
          iVar53 = (int)((uint)pqVar34[piVar10[uVar45]] * iVar53 + 0x10) >> 5;
        }
        iStack_648 = iStack_648 + (uVar40 & 0xfffff);
        uVar51 = ((uVar40 & 0xfffff) * iVar53 & 0xffffff) >> ((byte)iVar28 & 0x1f);
        uVar40 = -uVar51;
        if (cVar22 == '\0') {
          uVar40 = uVar51;
        }
        uVar51 = uVar27;
        if ((int)uVar40 < (int)uVar27) {
          uVar51 = uVar40;
        }
        if ((int)uVar40 < (int)uVar26) {
          uVar51 = uVar26;
        }
        ptVar8[(ulong)uVar3 + (long)iVar25] = uVar51;
      }
    }
    iVar25 = 7;
    if (iStack_648 < 7) {
      iVar25 = iStack_648;
    }
    bVar19 = (byte)iVar25;
    bVar20 = bVar19 + 0x10;
    if (uVar43 == 0) {
      bVar20 = bVar19;
    }
    if ((int)uVar43 < 0) {
      bVar20 = bVar19 | 8;
    }
    uVar43 = (uint)bVar20;
  }
  else {
    uVar43 = 0;
    if (plane == 0) {
      (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * row + col] = '\0';
      uVar43 = 0;
    }
  }
  av1_set_entropy_contexts
            (&dcb->xd,(dcb->xd).plane + plane,plane,plane_bsize,tx_size,uVar43,col,row);
  if ((((pMVar6->field_0xa7 & 0x80) != 0) || ('\0' < pMVar6->ref_frame[0])) &&
     (TVar23 = av1_get_tx_type(&dcb->xd,plane != 0,row,col,tx_size,
                               (uint)(cm->features).reduced_tx_set_used), plane == 0)) {
    iVar25 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    iVar28 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (((0x41010UL >> (uVar54 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar54 & 0x3f) & 1) != 0)) {
      lVar48 = (long)(dcb->xd).tx_type_map_stride;
      lVar47 = row * lVar48 + (long)col;
      for (lVar50 = 0; lVar50 < iVar28; lVar50 = lVar50 + 4) {
        for (lVar49 = 0; lVar49 < iVar25; lVar49 = lVar49 + 4) {
          (dcb->xd).tx_type_map[lVar49 + lVar47] = TVar23;
        }
        lVar47 = lVar47 + lVar48 * 4;
      }
    }
  }
  return;
}

Assistant:

static inline void read_coeffs_tx_intra_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int row, const int col, const TX_SIZE tx_size) {
  MB_MODE_INFO *mbmi = dcb->xd.mi[0];
  if (!mbmi->skip_txfm) {
#if TXCOEFF_TIMER
    struct aom_usec_timer timer;
    aom_usec_timer_start(&timer);
#endif
    av1_read_coeffs_txb(cm, dcb, r, plane, row, col, tx_size);
#if TXCOEFF_TIMER
    aom_usec_timer_mark(&timer);
    const int64_t elapsed_time = aom_usec_timer_elapsed(&timer);
    cm->txcoeff_timer += elapsed_time;
    ++cm->txb_count;
#endif
  }
}